

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O3

bool __thiscall
libmatroska::KaxBlockGroup::AddFrame
          (KaxBlockGroup *this,KaxTrackEntry *track,uint64 timecode,DataBuffer *buffer,
          LacingType lacing)

{
  KaxCluster *this_00;
  bool bVar1;
  KaxInternalBlock *this_01;
  uint64 uVar2;
  
  this_01 = (KaxInternalBlock *)
            libebml::EbmlMaster::FindFirstElt
                      (&this->super_EbmlMaster,(EbmlCallbacks *)KaxBlock::ClassInfos,true);
  this_00 = this->ParentCluster;
  if (this_00 != (KaxCluster *)0x0) {
    this_01->ParentCluster = this_00;
    if (this_01->bLocalTimecodeUsed == true) {
      uVar2 = KaxCluster::GetBlockGlobalTimecode(this_00,this_01->LocalTimecode);
      this_01->Timecode = uVar2;
      this_01->bLocalTimecodeUsed = false;
    }
    this->ParentTrack = track;
    bVar1 = KaxInternalBlock::AddFrame(this_01,track,timecode,buffer,lacing,false);
    return bVar1;
  }
  __assert_fail("ParentCluster != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                ,0x2d4,
                "bool libmatroska::KaxBlockGroup::AddFrame(const KaxTrackEntry &, uint64, DataBuffer &, LacingType)"
               );
}

Assistant:

bool KaxBlockGroup::AddFrame(const KaxTrackEntry & track, uint64 timecode, DataBuffer & buffer, LacingType lacing)
{
  KaxBlock & theBlock = GetChild<KaxBlock>(*this);
  assert(ParentCluster != NULL);
  theBlock.SetParent(*ParentCluster);
  ParentTrack = &track;
  return theBlock.AddFrame(track, timecode, buffer, lacing);
}